

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgkyujj(fitsfile *fptr,char *keyname,ULONGLONG *value,char *comm,int *status)

{
  char local_88 [8];
  char valstring [71];
  int *status_local;
  char *comm_local;
  ULONGLONG *value_local;
  char *keyname_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    ffgkey(fptr,keyname,local_88,comm,status);
    ffc2uj(local_88,value,status);
    fptr_local._4_4_ = *status;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgkyujj( fitsfile *fptr,     /* I - FITS file pointer         */
            const char *keyname,      /* I - name of keyword to read   */
            ULONGLONG *value,    /* O - keyword value             */
            char *comm,         /* O - keyword comment           */
            int  *status)       /* IO - error status             */
/*
  Read (get) the named keyword, returning the value and comment.
  The value will be implicitly converted to a (ULONGLONG) integer if it not
  already of this datatype.  The comment may be up to 69 characters long.
*/
{
    char valstring[FLEN_VALUE];

    if (*status > 0)
        return(*status);

    ffgkey(fptr, keyname, valstring, comm, status);  /* read the keyword */
    ffc2uj(valstring, value, status);   /* convert string to value */

    return(*status);
}